

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall Graph<Node>::Graph(Graph<Node> *this,int nodeCnt)

{
  int nodeCnt_local;
  Graph<Node> *this_local;
  
  vector<NodeList<Node>_>::vector(&this->G);
  vector<Edge>::vector(&this->edges);
  vector<vector<int>_>::vector(&this->minDist);
  vector<vector<int>_>::vector(&this->nextNodeInPath);
  vector<vector<int>_>::vector(&this->compList);
  vector<int>::vector(&this->inCC);
  this->_nodeCnt = nodeCnt;
  this->_edgeCnt = 0;
  vector<NodeList<Node>_>::resize(&this->G,nodeCnt);
  initializeRoyFloyd(this);
  return;
}

Assistant:

explicit Graph(int nodeCnt) {
        _nodeCnt = nodeCnt;
        _edgeCnt = 0;
        G.resize(nodeCnt);
        initializeRoyFloyd();
    }